

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O0

err_t btokSMRespWrap(octet *apdu,size_t *count,apdu_resp_t *resp,void *state)

{
  bool_t bVar1;
  void *pvVar2;
  octet *poVar3;
  octet *in_RCX;
  octet *in_RDX;
  size_t *in_RSI;
  long in_RDI;
  btok_sm_st *st;
  size_t c;
  size_t offset;
  size_t rdf_len;
  apdu_resp_t *in_stack_ffffffffffffffb8;
  apdu_resp_t *in_stack_ffffffffffffffc0;
  octet *poVar4;
  octet *der;
  err_t local_4;
  
  bVar1 = apduRespIsValid(in_stack_ffffffffffffffc0);
  if (bVar1 == 0) {
    local_4 = 0x138;
  }
  else {
    pvVar2 = (void *)apduRespEnc(&in_stack_ffffffffffffffc0->sw1,in_stack_ffffffffffffffb8);
    if (pvVar2 == (void *)0xffffffffffffffff) {
      local_4 = 0x138;
    }
    else if (in_RCX == (octet *)0x0) {
      if (in_RSI != (size_t *)0x0) {
        *in_RSI = (size_t)pvVar2;
      }
      local_4 = 0;
    }
    else {
      poVar3 = *(octet **)(in_RDX + 8);
      if (*(long *)(in_RDX + 8) != 0) {
        in_stack_ffffffffffffffc0 =
             (apdu_resp_t *)derTLEnc(in_RCX,(u32)((ulong)poVar3 >> 0x20),(size_t)pvVar2);
        poVar3 = &in_stack_ffffffffffffffc0->sw2 + (long)poVar3;
      }
      pvVar2 = (void *)derEnc(in_RCX,(u32)((ulong)poVar3 >> 0x20),pvVar2,
                              (size_t)in_stack_ffffffffffffffc0);
      poVar3 = (octet *)((long)pvVar2 + (long)poVar3);
      if (in_RDI == 0) {
        if (in_RSI != (size_t *)0x0) {
          *in_RSI = (size_t)(poVar3 + 2);
        }
        local_4 = 0;
      }
      else if ((uint)in_RCX[0x40] % 2 == 0) {
        poVar4 = (octet *)0x0;
        der = in_RCX;
        if (*(long *)(in_RDX + 8) != 0) {
          pvVar2 = (void *)derTLEnc(in_RCX,(u32)((ulong)poVar3 >> 0x20),0);
          memMove(pvVar2,in_RCX,0x1741ab);
          *(undefined1 *)(in_RDI + (long)pvVar2) = 2;
          pvVar2 = (void *)derTLEnc(der,(u32)((ulong)poVar3 >> 0x20),(size_t)poVar4);
          poVar4 = poVar4 + (long)pvVar2 + 1;
          beltCFBStart(poVar3,poVar4,(size_t)pvVar2,in_RCX);
          beltCFBStepE(poVar3,(size_t)poVar4,pvVar2);
          poVar4 = poVar4 + *(long *)(in_RDX + 8);
        }
        beltMACStart(poVar3,poVar4,(size_t)pvVar2);
        beltMACStepA(poVar3,(size_t)poVar4,pvVar2);
        beltMACStepA(poVar3,(size_t)poVar4,pvVar2);
        beltMACStepA(poVar3,(size_t)poVar4,pvVar2);
        beltMACStepA(poVar3,(size_t)poVar4,pvVar2);
        poVar3 = (octet *)derTLEnc(der,(u32)((ulong)poVar3 >> 0x20),(size_t)poVar4);
        poVar4 = poVar3 + (long)poVar4;
        beltMACStepG(poVar3,in_RCX);
        poVar4[in_RDI + 8] = *in_RDX;
        poVar4[in_RDI + 9] = in_RDX[1];
        if (in_RSI != (size_t *)0x0) {
          *in_RSI = (size_t)(poVar4 + 10);
        }
        local_4 = 0;
      }
      else {
        local_4 = 0x205;
      }
    }
  }
  return local_4;
}

Assistant:

err_t btokSMRespWrap(octet apdu[], size_t* count, const apdu_resp_t* resp,
	void* state)
{
	size_t rdf_len;
	size_t offset;
	size_t c;
	btok_sm_st* st;
	// pre
	ASSERT(memIsNullOrValid(state, btokSM_keep()));
	ASSERT(memIsNullOrValid(count, O_PER_S));
	// корректный ответ?
	if (!apduRespIsValid(resp))
		return ERR_BAD_APDU;
	// кодировать без защиты
	offset = apduRespEnc(apdu, resp);
	if (offset == SIZE_MAX)
		return ERR_BAD_APDU;
	// состояние не задано, т.е. защита не нужна?
	if (!state)
	{
		if (count)
		{
			ASSERT(memIsDisjoint2(count, O_PER_S, resp, apduRespSizeof(resp)));
			*count = offset;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(state, btokSM_keep(), resp, apduRespSizeof(resp)));
	// новая длина rdf
	rdf_len = resp->rdf_len;
	if (resp->rdf_len)
	{
		c = derTLEnc(0, 0x87, resp->rdf_len + 1);
		ASSERT(c != SIZE_MAX);
		rdf_len += c + 1;
	}
	c = derEnc(0, 0x8E, 0, 8);
	ASSERT(c != SIZE_MAX);
	rdf_len += c;
	// общая длина
	offset = rdf_len + 2;
	// не задан выходной буфер, т.е. нужно определить только его длину?
	if (!apdu)
	{
		if (count)
		{
			ASSERT(memIsDisjoint2(count, O_PER_S, state, btokSM_keep()));
			ASSERT(memIsDisjoint2(count, O_PER_S, resp, apduRespSizeof(resp)));
			*count = offset;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(apdu, offset, state, btokSM_keep()));
	ASSERT(memIsDisjoint2(apdu, offset, resp, apduRespSizeof(resp)));
	// проверить счетчик
	st = (btok_sm_st*)state;
	if (st->ctr[0] % 2 != 0)
		return ERR_BAD_LOGIC;
	// обработать rdf
	offset = 0;
	if (resp->rdf_len)
	{
		c = derTLEnc(0, 0x87, resp->rdf_len + 1);
		ASSERT(c != SIZE_MAX);
		// подготовить значение
		memMove(apdu + c + 1, apdu, resp->rdf_len);
		apdu[c] = 0x02;
		// кодировать TL
		c = derTLEnc(apdu, 0x87, resp->rdf_len + 1);
		ASSERT(c != SIZE_MAX);
		offset += c + 1;
		// зашифровать
		beltCFBStart(st->stack, st->key2, 32, st->ctr);
		beltCFBStepE(apdu + offset, resp->rdf_len, st->stack);
		// дальше
		offset += resp->rdf_len;
	}
	// вычислить имитовставку
	beltMACStart(st->stack, st->key1, 32);
	beltMACStepA(st->ctr, 16, st->stack);
	beltMACStepA(apdu, offset, st->stack);
	beltMACStepA(&resp->sw1, 1, st->stack);
	beltMACStepA(&resp->sw2, 1, st->stack);
	c = derTLEnc(apdu + offset, 0x8E, 8);
	ASSERT(c != SIZE_MAX);
	offset += c;
	beltMACStepG(apdu + offset, st->stack);
	offset += 8;
	// кодировать статусы
	apdu[offset++] = resp->sw1, apdu[offset++] = resp->sw2;
	// возвратить длину
	if (count)
	{
		ASSERT(memIsDisjoint2(count, O_PER_S, state, btokSM_keep()));
		ASSERT(memIsDisjoint2(count, O_PER_S, resp, apduRespSizeof(resp)));
		ASSERT(memIsDisjoint2(count, O_PER_S, apdu, offset));
		*count = offset;
	}
	// завершить
	return ERR_OK;
}